

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpring2Constraint::calculateTransforms
          (btGeneric6DofSpring2Constraint *this,btTransform *transA,btTransform *transB)

{
  btRigidBody *pbVar1;
  btTypedConstraint *in_RDI;
  btScalar bVar2;
  btScalar bVar3;
  btScalar miS;
  btScalar miB;
  btScalar miA;
  btGeneric6DofSpring2Constraint *in_stack_00000230;
  btTransform *in_stack_ffffffffffffff48;
  bool local_a5;
  btTransform *in_stack_ffffffffffffffa0;
  btTransform *in_stack_ffffffffffffffa8;
  btGeneric6DofSpring2Constraint *in_stack_ffffffffffffffe0;
  
  btTransform::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  btTransform::operator=((btTransform *)in_RDI,in_stack_ffffffffffffff48);
  btTransform::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  btTransform::operator=((btTransform *)in_RDI,in_stack_ffffffffffffff48);
  calculateLinearInfo(in_stack_ffffffffffffffe0);
  calculateAngleInfo(in_stack_00000230);
  pbVar1 = btTypedConstraint::getRigidBodyA(in_RDI);
  bVar2 = btRigidBody::getInvMass(pbVar1);
  pbVar1 = btTypedConstraint::getRigidBodyB(in_RDI);
  bVar3 = btRigidBody::getInvMass(pbVar1);
  local_a5 = bVar2 < 1.1920929e-07 || bVar3 < 1.1920929e-07;
  in_RDI[0x14].field_0x24 = local_a5;
  if (bVar2 + bVar3 <= 0.0) {
    in_RDI[0x14].m_isEnabled = false;
    in_RDI[0x14].m_needsFeedback = false;
    *(undefined2 *)&in_RDI[0x14].field_0x1e = 0x3f00;
  }
  else {
    *(float *)&in_RDI[0x14].m_isEnabled = bVar3 / (bVar2 + bVar3);
  }
  in_RDI[0x14].m_overrideNumSolverIterations = (int)(1.0 - *(float *)&in_RDI[0x14].m_isEnabled);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::calculateTransforms(const btTransform& transA,const btTransform& transB)
{
	m_calculatedTransformA = transA * m_frameInA;
	m_calculatedTransformB = transB * m_frameInB;
	calculateLinearInfo();
	calculateAngleInfo();

	btScalar miA = getRigidBodyA().getInvMass();
	btScalar miB = getRigidBodyB().getInvMass();
	m_hasStaticBody = (miA < SIMD_EPSILON) || (miB < SIMD_EPSILON);
	btScalar miS = miA + miB;
	if(miS > btScalar(0.f))
	{
		m_factA = miB / miS;
	}
	else 
	{
		m_factA = btScalar(0.5f);
	}
	m_factB = btScalar(1.0f) - m_factA;
}